

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void cmCacheManager::OutputValueNoNewlines(ostream *fout,string *value)

{
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  string *value_local;
  ostream *fout_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 != ' ') {
      pcVar2 = (char *)std::__cxx11::string::back();
      if (*pcVar2 != '\t') goto LAB_003e0788;
    }
    poVar3 = std::operator<<(fout,'\'');
    poVar3 = std::operator<<(poVar3,(string *)value);
    std::operator<<(poVar3,'\'');
  }
  else {
LAB_003e0788:
    std::operator<<(fout,(string *)value);
  }
  return;
}

Assistant:

void cmCacheManager::OutputValueNoNewlines(std::ostream& fout,
                                           std::string const& value)
{
  // if value has trailing space or tab, enclose it in single quotes
  if (!value.empty() && (value.back() == ' ' || value.back() == '\t')) {
    fout << '\'' << value << '\'';
  } else {
    fout << value;
  }
}